

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O0

void BamTools::Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
               OptionGroup *group,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue)

{
  Option *this;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  key_type *in_R8;
  string *in_R9;
  string *in_stack_00000010;
  OptionValue ov;
  Option o;
  OptionValue *in_stack_fffffffffffffea8;
  Variant *in_stack_fffffffffffffeb0;
  value_type *__x;
  OptionValue *in_stack_fffffffffffffec0;
  Option *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  Variant *in_stack_ffffffffffffff00;
  string local_d8 [56];
  value_type local_a0;
  string *local_30;
  key_type *local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  __x = &local_a0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Option::Option(in_stack_fffffffffffffed0);
  std::__cxx11::string::operator=((string *)__x,local_8);
  std::__cxx11::string::operator=((string *)&local_a0.ValueDescription,local_10);
  std::__cxx11::string::operator=((string *)&local_a0.Description,local_18);
  std::__cxx11::string::string(local_d8,in_stack_00000010);
  Variant::Variant<std::__cxx11::string>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Variant::operator=(in_stack_fffffffffffffeb0,(Variant *)in_stack_fffffffffffffea8);
  Variant::~Variant(in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_d8);
  local_a0.HasDefaultValue = true;
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            ((vector<BamTools::Option,_std::allocator<BamTools::Option>_> *)
             in_stack_fffffffffffffec0,__x);
  OptionValue::OptionValue(in_stack_fffffffffffffec0);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffec0,local_30);
  Variant::Variant<std::__cxx11::string>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Variant::operator=(in_stack_fffffffffffffeb0,(Variant *)in_stack_fffffffffffffea8);
  Variant::~Variant(in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  std::__cxx11::string::empty();
  std::__cxx11::string::operator=((string *)&stack0xfffffffffffffef8,local_20);
  this = (Option *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
                       *)local_30,local_28);
  OptionValue::operator=((OptionValue *)this,in_stack_fffffffffffffea8);
  OptionValue::~OptionValue((OptionValue *)this);
  Option::~Option(this);
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group, D& defaultValue)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    o.DefaultValue = defaultValue;
    o.HasDefaultValue = true;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}